

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O2

double __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::compute_integral_of_landscape
          (Persistence_landscape_on_grid *this)

{
  size_t sVar1;
  size_t i;
  size_t level;
  double dVar2;
  double dVar3;
  
  sVar1 = number_of_nonzero_levels(this);
  dVar2 = 0.0;
  for (level = 0; sVar1 != level; level = level + 1) {
    dVar3 = compute_integral_of_landscape(this,level);
    dVar2 = dVar2 + dVar3;
  }
  return dVar2;
}

Assistant:

double compute_integral_of_landscape() const {
    size_t maximal_level = this->number_of_nonzero_levels();
    double result = 0;
    for (size_t i = 0; i != maximal_level; ++i) {
      result += this->compute_integral_of_landscape(i);
    }
    return result;
  }